

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

uint64_t __thiscall bitfoot::Bitfoot::RookXO(Bitfoot *this,int sqr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  if ((uint)sqr < 0x40) {
    uVar1 = NorthXO(this,sqr);
    uVar2 = EastXO(this,sqr);
    uVar3 = SouthXO(this,sqr);
    uVar4 = WestXO(this,sqr);
    return uVar4 | uVar3 | uVar2 | uVar1;
  }
  __assert_fail("IS_SQUARE(sqr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,600,"uint64_t bitfoot::Bitfoot::RookXO(const int) const");
}

Assistant:

inline uint64_t RookXO(const int sqr) const {
    assert(IS_SQUARE(sqr));
    return (NorthXO(sqr) | EastXO(sqr) |
            SouthXO(sqr) | WestXO(sqr));
  }